

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hvtool.cpp
# Opt level: O2

void vectorwrite32le<std::shared_ptr<ReadWriter>>(shared_ptr<ReadWriter> *wr,DwordVector *v)

{
  element_type *peVar1;
  pointer puVar2;
  uint local_2c;
  
  for (puVar2 = (v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      puVar2 != (v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish; puVar2 = puVar2 + 1) {
    peVar1 = (wr->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_2c = *puVar2;
    (*peVar1->_vptr_ReadWriter[3])(peVar1,&local_2c,4);
  }
  return;
}

Assistant:

void vectorwrite32le(PTR wr, const DwordVector& v)
    {
        for (DwordVector::const_iterator i= v.begin() ; i!=v.end() ; ++i)
            wr->write32le(*i);
    }